

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

bool __thiscall
miniply::PLYReader::load_binary_scalar_property_big_endian
          (PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  size_t sVar1;
  bool bVar2;
  
  sVar1 = *destIndex;
  bVar2 = load_binary_scalar_property(this,prop,destIndex);
  if (bVar2) {
    endian_swap((this->m_elementData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + sVar1,prop->type);
  }
  return bVar2;
}

Assistant:

bool PLYReader::load_binary_scalar_property_big_endian(PLYProperty &prop, size_t &destIndex)
  {
    size_t startIndex = destIndex;
    if (load_binary_scalar_property(prop, destIndex)) {
      endian_swap(m_elementData.data() + startIndex, prop.type);
      return true;
    }
    else {
      return false;
    }
  }